

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# update_segment.cpp
# Opt level: O3

bool __thiscall
duckdb::UpdateSegment::HasUpdates(UpdateSegment *this,idx_t start_row_index,idx_t end_row_index)

{
  StorageLockKey *pSVar1;
  ulong vector_idx;
  bool bVar2;
  bool bVar3;
  UndoBufferPointer UVar4;
  _Tuple_impl<0UL,_duckdb::StorageLockKey_*,_std::default_delete<duckdb::StorageLockKey>_> local_30;
  
  pSVar1 = (StorageLockKey *)&this->lock;
  StorageLock::GetSharedLock((StorageLock *)&local_30);
  if ((this->root).super_unique_ptr<duckdb::UpdateNode,_std::default_delete<duckdb::UpdateNode>_>.
      _M_t.super___uniq_ptr_impl<duckdb::UpdateNode,_std::default_delete<duckdb::UpdateNode>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::UpdateNode_*,_std::default_delete<duckdb::UpdateNode>_>.
      super__Head_base<0UL,_duckdb::UpdateNode_*,_false>._M_head_impl != (UpdateNode *)0x0) {
    if (start_row_index >> 0xb <= end_row_index >> 0xb) {
      vector_idx = start_row_index >> 0xb;
      do {
        unique_ptr<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>,_true>::
        operator*((unique_ptr<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>,_true>
                   *)&local_30);
        UVar4 = GetUpdateNode(this,pSVar1,vector_idx);
        bVar2 = UVar4.entry != (UndoBufferEntry *)0x0;
        if (bVar2) break;
        bVar3 = end_row_index >> 0xb != vector_idx;
        vector_idx = vector_idx + 1;
      } while (bVar3);
      goto LAB_005fdb29;
    }
  }
  bVar2 = false;
LAB_005fdb29:
  if (local_30.super__Head_base<0UL,_duckdb::StorageLockKey_*,_false>._M_head_impl !=
      (StorageLockKey *)0x0) {
    StorageLockKey::~StorageLockKey
              ((StorageLockKey *)
               local_30.super__Head_base<0UL,_duckdb::StorageLockKey_*,_false>._M_head_impl);
    operator_delete((void *)local_30.super__Head_base<0UL,_duckdb::StorageLockKey_*,_false>.
                            _M_head_impl);
  }
  return bVar2;
}

Assistant:

bool UpdateSegment::HasUpdates(idx_t start_row_index, idx_t end_row_index) {
	auto read_lock = lock.GetSharedLock();
	if (!root) {
		return false;
	}
	idx_t base_vector_index = start_row_index / STANDARD_VECTOR_SIZE;
	idx_t end_vector_index = end_row_index / STANDARD_VECTOR_SIZE;
	for (idx_t i = base_vector_index; i <= end_vector_index; i++) {
		auto entry = GetUpdateNode(*read_lock, i);
		if (entry.IsSet()) {
			return true;
		}
	}
	return false;
}